

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program_types.cpp
# Opt level: O0

void __thiscall Clasp::Asp::PrgDisj::detach(PrgDisj *this,LogicProgram *prg,bool full)

{
  PrgHead *pPVar1;
  byte in_DL;
  LogicProgram *in_RSI;
  PrgDisj *in_RDI;
  sup_iterator end_1;
  sup_iterator it_1;
  EdgeVec temp;
  atom_iterator end;
  atom_iterator it;
  PrgEdge edge;
  PrgBody *in_stack_ffffffffffffff68;
  LogicProgram *in_stack_ffffffffffffff70;
  PrgHead *pPVar2;
  PrgHead *in_stack_ffffffffffffff88;
  PrgHead *h;
  undefined8 in_stack_ffffffffffffff90;
  PrgBody *this_00;
  PrgHead *local_58;
  PrgBody local_40;
  atom_iterator local_28;
  atom_iterator local_20;
  PrgEdge local_18;
  byte local_11;
  LogicProgram *local_10;
  
  local_11 = in_DL & 1;
  local_10 = in_RSI;
  local_18 = PrgEdge::newEdge<Clasp::Asp::PrgDisj>((PrgDisj *)in_stack_ffffffffffffff68,Normal);
  local_20 = begin(in_RDI);
  local_28 = PrgDisj::end((PrgDisj *)in_stack_ffffffffffffff70);
  for (; local_20 != local_28; local_20 = local_20 + 1) {
    LogicProgram::getAtom
              (in_stack_ffffffffffffff70,(Id_t)((ulong)in_stack_ffffffffffffff68 >> 0x20));
    local_40.headData_.sm[1].rep = (PrgEdge)(PrgEdge)local_18.rep;
    PrgHead::removeSupport
              (in_stack_ffffffffffffff88,(PrgEdge)(uint32)((ulong)in_stack_ffffffffffffff90 >> 0x20)
              );
  }
  this_00 = &local_40;
  bk_lib::pod_vector<Clasp::Asp::PrgEdge,_std::allocator<Clasp::Asp::PrgEdge>_>::pod_vector
            ((pod_vector<Clasp::Asp::PrgEdge,_std::allocator<Clasp::Asp::PrgEdge>_> *)this_00);
  bk_lib::pod_vector<Clasp::Asp::PrgEdge,_std::allocator<Clasp::Asp::PrgEdge>_>::swap
            ((pod_vector<Clasp::Asp::PrgEdge,_std::allocator<Clasp::Asp::PrgEdge>_> *)
             in_stack_ffffffffffffff70,
             (pod_vector<Clasp::Asp::PrgEdge,_std::allocator<Clasp::Asp::PrgEdge>_> *)
             in_stack_ffffffffffffff68);
  local_58 = (PrgHead *)
             bk_lib::pod_vector<Clasp::Asp::PrgEdge,_std::allocator<Clasp::Asp::PrgEdge>_>::begin
                       ((pod_vector<Clasp::Asp::PrgEdge,_std::allocator<Clasp::Asp::PrgEdge>_> *)
                        &local_40);
  h = local_58;
  pPVar1 = (PrgHead *)
           bk_lib::pod_vector<Clasp::Asp::PrgEdge,_std::allocator<Clasp::Asp::PrgEdge>_>::end
                     ((pod_vector<Clasp::Asp::PrgEdge,_std::allocator<Clasp::Asp::PrgEdge>_> *)
                      &local_40);
  pPVar2 = pPVar1;
  for (; local_58 != pPVar1; local_58 = (PrgHead *)&(local_58->super_PrgNode).field_0x4) {
    in_stack_ffffffffffffff70 = local_10;
    PrgEdge::node((PrgEdge *)local_58);
    in_stack_ffffffffffffff68 =
         LogicProgram::getBody
                   (in_stack_ffffffffffffff70,(Id_t)((ulong)in_stack_ffffffffffffff68 >> 0x20));
    PrgBody::removeHead(this_00,h,(EdgeType)((ulong)pPVar2 >> 0x20));
  }
  if ((local_11 & 1) == 0) {
    bk_lib::pod_vector<Clasp::Asp::PrgEdge,_std::allocator<Clasp::Asp::PrgEdge>_>::swap
              ((pod_vector<Clasp::Asp::PrgEdge,_std::allocator<Clasp::Asp::PrgEdge>_> *)
               in_stack_ffffffffffffff70,
               (pod_vector<Clasp::Asp::PrgEdge,_std::allocator<Clasp::Asp::PrgEdge>_> *)
               in_stack_ffffffffffffff68);
  }
  else {
    PrgHead::clearSupports((PrgHead *)in_stack_ffffffffffffff70);
    PrgNode::markRemoved((PrgNode *)in_stack_ffffffffffffff70);
  }
  bk_lib::pod_vector<Clasp::Asp::PrgEdge,_std::allocator<Clasp::Asp::PrgEdge>_>::~pod_vector
            ((pod_vector<Clasp::Asp::PrgEdge,_std::allocator<Clasp::Asp::PrgEdge>_> *)0x1a5fbf);
  return;
}

Assistant:

void PrgDisj::detach(LogicProgram& prg, bool full) {
	PrgEdge edge = PrgEdge::newEdge(*this, PrgEdge::Choice);
	for (atom_iterator it = begin(), end = this->end(); it != end; ++it) {
		prg.getAtom(*it)->removeSupport(edge);
	}
	EdgeVec temp; temp.swap(supports_);
	for (PrgDisj::sup_iterator it = temp.begin(), end = temp.end(); it != end; ++it) {
		prg.getBody(it->node())->removeHead(this, PrgEdge::Normal);
	}
	if (full) {
		clearSupports();
		markRemoved();
	}
	else {
		supports_.swap(temp);
	}
}